

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void DoReadyWeaponDisableSwitch(AActor *self,INTBOOL disable)

{
  player_t *ppVar1;
  player_t *player;
  INTBOOL disable_local;
  AActor *self_local;
  
  if ((self != (AActor *)0x0) && (ppVar1 = self->player, ppVar1 != (player_t *)0x0)) {
    if (disable == 0) {
      ppVar1->WeaponState = ppVar1->WeaponState & 0xffef;
    }
    else {
      ppVar1->WeaponState = ppVar1->WeaponState | 0x10;
      ppVar1->WeaponState = ppVar1->WeaponState & 0xff7f;
    }
  }
  return;
}

Assistant:

void DoReadyWeaponDisableSwitch (AActor *self, INTBOOL disable)
{
	// Discard all switch attempts?
	player_t *player;
	if (self && (player = self->player))
	{
		if (disable)
		{
			player->WeaponState |= WF_DISABLESWITCH;
			player->WeaponState &= ~WF_REFIRESWITCHOK;
		}
		else
		{
			player->WeaponState &= ~WF_DISABLESWITCH;
		}
	}
}